

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

UnknownFieldOps * google::protobuf::internal::TcParser::GetUnknownFieldOps(TcParseTableBase *table)

{
  TailCallParseFunc p_Var1;
  UnknownFieldOps *pUVar2;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_20 [2];
  char *ptr;
  TcParseTableBase *table_local;
  
  p_Var1 = table->fallback;
  ptr = (char *)table;
  TcFieldData::TcFieldData((TcFieldData *)local_20);
  pUVar2 = (UnknownFieldOps *)
           (*p_Var1)((MessageLite *)0x0,(char *)0x0,(ParseContext *)0x0,(TcFieldData)local_20[0],
                     (TcParseTableBase *)0x0,0);
  return pUVar2;
}

Assistant:

const TcParser::UnknownFieldOps& TcParser::GetUnknownFieldOps(
    const TcParseTableBase* table) {
  // Call the fallback function in a special mode to only act as a
  // way to return the ops.
  // Hiding the unknown fields vtable behind the fallback function avoids adding
  // more pointers in TcParseTableBase, and the extra runtime jumps are not
  // relevant because unknown fields are rare.
  const char* ptr = table->fallback(nullptr, nullptr, nullptr, {}, nullptr, 0);
  return *reinterpret_cast<const UnknownFieldOps*>(ptr);
}